

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O1

void __thiscall
gmlc::concurrency::DelayedObjects<int>::fulfillAllPromises(DelayedObjects<int> *this,int *val)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *this_00;
  _Base_ptr p_Var3;
  mapped_type *this_01;
  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
  *__range3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->promiseLock);
  if (iVar2 == 0) {
    p_Var3 = (this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->promiseByInteger)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        std::promise<int>::set_value((promise<int> *)&p_Var3[1]._M_parent,val);
        this_00 = std::
                  map<int,_std::promise<int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
                  ::operator[](&this->usedPromiseByInteger,(key_type *)(p_Var3 + 1));
        std::promise<int>::operator=(this_00,(promise<int> *)&p_Var3[1]._M_parent);
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    p_Var3 = (this->promiseByString)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->promiseByString)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        std::promise<int>::set_value((promise<int> *)(p_Var3 + 2),val);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
                  ::operator[](&this->usedPromiseByString,(key_type *)(p_Var3 + 1));
        std::promise<int>::operator=(this_01,(promise<int> *)(p_Var3 + 2));
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_std::promise<int>_>,_std::_Select1st<std::pair<const_int,_std::promise<int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<int>_>_>_>
             *)this);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<int>_>_>_>
    ::clear(&(this->promiseByString)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->promiseLock);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void fulfillAllPromises(const X& val)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        for (auto& pr : promiseByInteger) {
            pr.second.set_value(val);
            usedPromiseByInteger[pr.first] = std::move(pr.second);
        }
        for (auto& pr : promiseByString) {
            pr.second.set_value(val);
            usedPromiseByString[pr.first] = std::move(pr.second);
        }
        promiseByInteger.clear();
        promiseByString.clear();
    }